

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings(SimpleParallelAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *pAVar1;
  pointer pAVar2;
  AnalyzerSettingInterfaceNumberList *this_00;
  pointer pAVar3;
  reference pvVar4;
  value_type *__x;
  value_type *__x_00;
  Channel *pCVar5;
  uint uVar6;
  char local_d8 [8];
  char text_1 [64];
  uint local_90;
  uint local_8c;
  U32 i_2;
  U32 i_1;
  char text [64];
  AnalyzerSettingInterfaceChannel *local_40;
  AnalyzerSettingInterfaceChannel *data_channel_interface;
  uint local_24;
  uint local_20;
  U32 i;
  U32 count;
  SimpleParallelAnalyzerSettings *local_10;
  SimpleParallelAnalyzerSettings *this_local;
  
  local_10 = this;
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__SimpleParallelAnalyzerSettings_0011fd68;
  std::vector<Channel,_std::allocator<Channel>_>::vector(&this->mDataChannels);
  __x = (value_type *)0xffffffffffffffff;
  Channel::Channel(&this->mClockChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mClockEdge = PosEdge;
  std::vector<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
  ::vector(&this->mDataChannelsInterface);
  std::
  unique_ptr<AnalyzerSettingInterfaceChannel,std::default_delete<AnalyzerSettingInterfaceChannel>>::
  unique_ptr<std::default_delete<AnalyzerSettingInterfaceChannel>,void>
            ((unique_ptr<AnalyzerSettingInterfaceChannel,std::default_delete<AnalyzerSettingInterfaceChannel>>
              *)&this->mClockChannelInterface);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
  ::unique_ptr<std::default_delete<AnalyzerSettingInterfaceNumberList>,void>
            ((unique_ptr<AnalyzerSettingInterfaceNumberList,std::default_delete<AnalyzerSettingInterfaceNumberList>>
              *)&this->mClockEdgeInterface);
  local_20 = 0x10;
  for (local_24 = 0; local_24 < local_20; local_24 = local_24 + 1) {
    Channel::Channel((Channel *)&data_channel_interface,0xffffffffffffffff,0xffffffff,
                     DIGITAL_CHANNEL);
    __x_00 = (value_type *)&data_channel_interface;
    std::vector<Channel,_std::allocator<Channel>_>::push_back(&this->mDataChannels,__x_00);
    Channel::~Channel((Channel *)&data_channel_interface);
    pAVar1 = (AnalyzerSettingInterfaceChannel *)
             AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)__x_00);
    AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
    local_40 = pAVar1;
    sprintf((char *)&i_2,"D%d",(ulong)local_24);
    AnalyzerSettingInterface::SetTitleAndTooltip((char *)local_40,(char *)&i_2);
    pAVar1 = local_40;
    std::vector<Channel,_std::allocator<Channel>_>::operator[](&this->mDataChannels,(ulong)local_24)
    ;
    AnalyzerSettingInterfaceChannel::SetChannel((Channel *)pAVar1);
    AnalyzerSettingInterfaceChannel::SetSelectionOfNoneIsAllowed(SUB81(local_40,0));
    __x = &local_40;
    std::
    vector<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>::
    push_back(&this->mDataChannelsInterface,__x);
  }
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)__x);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::
  unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ::reset(&this->mClockChannelInterface,pAVar1);
  pAVar2 = std::
           unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
           ::operator->(&this->mClockChannelInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar2,"Clock");
  pAVar2 = std::
           unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
           ::operator->(&this->mClockChannelInterface);
  pCVar5 = &this->mClockChannel;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)pAVar2);
  this_00 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar5);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_00);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::reset(&this->mClockEdgeInterface,this_00);
  pAVar3 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mClockEdgeInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar3,"Clock State");
  pAVar3 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mClockEdgeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)pAVar3,"Rising edge");
  pAVar3 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mClockEdgeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)pAVar3,"Falling edge");
  pAVar3 = std::
           unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ::operator->(&this->mClockEdgeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)pAVar3,"Dual edge");
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::operator->(&this->mClockEdgeInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)(int)this->mClockEdge);
  for (local_8c = 0; local_8c < local_20; local_8c = local_8c + 1) {
    std::
    vector<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>::
    operator[](&this->mDataChannelsInterface,(ulong)local_8c);
    AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  }
  std::
  unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ::get(&this->mClockChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::get(&this->mClockEdgeInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar6 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar6,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar6,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar6,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  for (local_90 = 0; local_90 < local_20; local_90 = local_90 + 1) {
    sprintf(local_d8,"D%d",(ulong)local_90);
    pvVar4 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                       (&this->mDataChannels,(ulong)local_90);
    AnalyzerSettings::AddChannel((Channel *)this,(char *)pvVar4,SUB81(local_d8,0));
  }
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,true);
  return;
}

Assistant:

SimpleParallelAnalyzerSettings::SimpleParallelAnalyzerSettings()
    : mClockChannel( UNDEFINED_CHANNEL ), mClockEdge( ParallelAnalyzerClockEdge::PosEdge )
{
    U32 count = 16;
    for( U32 i = 0; i < count; i++ )
    {
        mDataChannels.push_back( UNDEFINED_CHANNEL );
        AnalyzerSettingInterfaceChannel* data_channel_interface = new AnalyzerSettingInterfaceChannel();

        char text[ 64 ];
        sprintf( text, "D%d", i );

        data_channel_interface->SetTitleAndTooltip( text, text );
        data_channel_interface->SetChannel( mDataChannels[ i ] );
        data_channel_interface->SetSelectionOfNoneIsAllowed( true );

        mDataChannelsInterface.push_back( data_channel_interface );
    }


    mClockChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mClockChannelInterface->SetTitleAndTooltip( "Clock", "Clock" );
    mClockChannelInterface->SetChannel( mClockChannel );

    mClockEdgeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mClockEdgeInterface->SetTitleAndTooltip( "Clock State", "Define whether the data is valid on Clock rising or falling edge" );
    mClockEdgeInterface->AddNumber( static_cast<double>( ParallelAnalyzerClockEdge::PosEdge ), "Rising edge", "" );
    mClockEdgeInterface->AddNumber( static_cast<double>( ParallelAnalyzerClockEdge::NegEdge ), "Falling edge", "" );
    mClockEdgeInterface->AddNumber( static_cast<double>( ParallelAnalyzerClockEdge::DualEdge ), "Dual edge", "" );
    mClockEdgeInterface->SetNumber( static_cast<double>( mClockEdge ) );


    for( U32 i = 0; i < count; i++ )
    {
        AddInterface( mDataChannelsInterface[ i ] );
    }

    AddInterface( mClockChannelInterface.get() );
    AddInterface( mClockEdgeInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    for( U32 i = 0; i < count; i++ )
    {
        char text[ 64 ];
        sprintf( text, "D%d", i );
        AddChannel( mDataChannels[ i ], text, false );
    }

    AddChannel( mClockChannel, "Clock", false );
}